

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  byte *pbVar1;
  char *__s;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  size_t sVar5;
  undefined1 auVar6 [4];
  result rVar7;
  type tVar8;
  round_direction rVar9;
  ulong uVar10;
  decimal_fp<float> dVar11;
  format_error *this;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined8 extraout_RDX;
  size_t count;
  int iVar16;
  long *plVar17;
  ulong uVar18;
  int iVar19;
  uint64_t uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint64_t error;
  ulong uVar24;
  bool bVar25;
  fp fVar26;
  fp fVar27;
  decimal_fp<double> dVar28;
  ulong uStackY_b0;
  int *in_stack_ffffffffffffff58;
  undefined1 local_9c [4];
  gen_digits_handler handler;
  int cached_exp10;
  double local_60;
  ulong local_58;
  ulong local_50;
  uint64_t local_48;
  fp local_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  uVar10 = (ulong)specs & 0xff00000000;
  bVar25 = uVar10 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && uVar10 == 0x200000000) {
      tVar8 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar8);
      __s = buf->ptr_;
      tVar8 = to_unsigned<int>(precision);
      memset(__s,0x30,(ulong)tVar8);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  uVar13 = specs._4_4_;
  if ((uVar13 >> 0x13 & 1) != 0) {
    iVar16 = snprintf_float<double>(value,precision,specs,buf);
    return iVar16;
  }
  if (precision < 0) {
    if ((uVar13 >> 0x12 & 1) == 0) {
      dVar28 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar28.significand);
      return dVar28.exponent;
    }
    dVar11 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar11.significand);
    return dVar11.exponent;
  }
  cached_exp10 = 0;
  local_60 = value;
  fp::assign<double,_0>(&local_40,value);
  fVar26.f = (ulong)(uint)local_40.e;
  fVar26._8_8_ = extraout_RDX;
  fVar26 = normalize<0>((detail *)local_40.f,fVar26);
  fVar27 = get_cached_power(-0x7c - fVar26.e,&cached_exp10);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = fVar27.f;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = fVar26.f;
  uVar24 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
  pbVar1 = (byte *)buf->ptr_;
  handler.size = 0;
  iVar19 = fVar27.e + fVar26.e;
  iVar16 = -cached_exp10;
  bVar12 = -(char)iVar19;
  uVar20 = 1L << (bVar12 & 0x3f);
  uVar18 = uVar24 >> (bVar12 & 0x3f);
  handler.buf = (char *)pbVar1;
  handler.precision = precision;
  handler.exp10 = iVar16;
  handler.fixed = bVar25;
  if ((uint)uVar18 == 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x2ba,"");
  }
  if (uVar18 >> 0x20 != 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                ,699,"");
  }
  uVar14 = (uint)uVar18 | 1;
  uVar15 = 0x1f;
  if (uVar14 != 0) {
    for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar21 = uVar18 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar15 * 8);
  uVar15 = -iVar19 - 0x40;
  uVar22 = uVar21 >> 0x20;
  iVar19 = (int)(uVar21 >> 0x20);
  if (uVar10 == 0x200000000) {
    uVar14 = iVar19 - cached_exp10;
    if ((uVar14 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar14) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    handler.precision = uVar14 + precision;
    if (handler.precision != 0 && SCARRY4(uVar14,precision) == handler.precision < 0)
    goto LAB_0011198b;
    if (handler.precision < 0) goto LAB_00111bd6;
    iVar23 = 0;
    rVar9 = get_round_direction(*(long *)(basic_impl_data<void>::power_of_10_64 +
                                         ((long)(uVar21 - 0x100000000) >> 0x20) * 8) <<
                                ((byte)uVar15 & 0x3f),uVar24 / 10,10);
    if (rVar9 != unknown) {
      handler.size = 1;
      *pbVar1 = rVar9 == up | 0x30;
      goto LAB_00111bd6;
    }
  }
  else {
LAB_0011198b:
    local_50 = uVar20 - 1;
    uVar24 = uVar24 & local_50;
    plVar17 = (long *)(basic_impl_data<void>::power_of_10_64 + (ulong)(iVar19 - 1) * 8);
    error = 1;
    local_58 = (ulong)uVar15;
    local_48 = uVar20;
    do {
      uVar15 = (uint)uVar22;
      switch(uVar15 - 1) {
      case 0:
        cVar4 = (char)uVar18;
        uVar18 = 0;
        goto LAB_00111a3f;
      case 1:
        uStackY_b0 = 10;
        break;
      case 2:
        uStackY_b0 = 100;
        break;
      case 3:
        uStackY_b0 = 1000;
        break;
      case 4:
        uStackY_b0 = 10000;
        break;
      case 5:
        uStackY_b0 = 100000;
        break;
      case 6:
        uStackY_b0 = 1000000;
        break;
      case 7:
        uStackY_b0 = 10000000;
        break;
      case 8:
        uStackY_b0 = 100000000;
        break;
      case 9:
        uStackY_b0 = 1000000000;
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x2ff,"invalid number of digits");
      }
      cVar4 = (char)((uVar18 & 0xffffffff) / uStackY_b0);
      uVar18 = (uVar18 & 0xffffffff) % uStackY_b0;
LAB_00111a3f:
      rVar7 = gen_digits_handler::on_digit
                        (&handler,cVar4 + '0',*plVar17 << ((byte)local_58 & 0x3f),
                         (uVar18 << ((byte)local_58 & 0x3f)) + uVar24,1,true);
      uVar21 = local_58;
      if (rVar7 != more) {
        iVar19 = uVar15 - 1;
        goto LAB_00111b8c;
      }
      plVar17 = plVar17 + -1;
      uVar22 = (ulong)(uVar15 - 1);
    } while (1 < uVar15);
    iVar19 = 0;
    do {
      uVar18 = uVar24 * 10;
      error = error * 10;
      uVar24 = uVar18 & local_50;
      iVar19 = iVar19 + -1;
      local_9c = (undefined1  [4])iVar19;
      rVar7 = gen_digits_handler::on_digit
                        (&handler,(char)(uVar18 >> ((byte)uVar21 & 0x3f)) + '0',local_48,uVar24,
                         error,false);
    } while (rVar7 == more);
LAB_00111b8c:
    iVar16 = handler.exp10;
    iVar23 = handler.size;
    if (rVar7 != error) {
LAB_00111bd6:
      local_9c = (undefined1  [4])(iVar19 + iVar16);
      tVar8 = to_unsigned<int>(handler.size);
      buffer<char>::try_resize(buf,(ulong)tVar8);
      goto LAB_00111c43;
    }
  }
  iVar16 = handler.precision;
  local_9c = (undefined1  [4])(~cached_exp10 + iVar19 + iVar23);
  handler.buf = (char *)0x0;
  handler.size = 0;
  if ((uVar13 >> 0x12 & 1) == 0) {
    bVar25 = fp::assign<double,_0>((fp *)&handler,local_60);
  }
  else {
    bVar25 = fp::assign<float,_0>((fp *)&handler,(float)local_60);
  }
  iVar19 = 0x2ff;
  if (iVar16 < 0x2ff) {
    iVar19 = iVar16;
  }
  fVar27.f = (ulong)(uint)handler.size;
  fVar27.e._0_1_ = bVar25;
  fVar27._9_7_ = 0;
  format_dragon((detail *)handler.buf,fVar27,SUB41(iVar19,0),(int)buf,(buffer<char> *)local_9c,
                in_stack_ffffffffffffff58);
LAB_00111c43:
  if ((uVar13 >> 0x14 & 1) == 0 && uVar10 != 0x200000000) {
    sVar5 = buf->size_;
    auVar6 = local_9c;
    do {
      local_9c = auVar6;
      count = sVar5;
      if (count == 0) break;
      sVar5 = count - 1;
      auVar6 = (undefined1  [4])((int)local_9c + 1);
    } while (buf->ptr_[count - 1] == '0');
    buffer<char>::try_resize(buf,count);
  }
  return (int)local_9c;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}